

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

void __thiscall wabt::LoadStoreTracking::Track(LoadStoreTracking *this,Node *n)

{
  uint uVar1;
  pointer pNVar2;
  Type type;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar3;
  Opcode opc;
  Node *c;
  pointer n_00;
  
  pNVar2 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start; n_00 != pNVar2; n_00 = n_00 + 1) {
    Track(this,n_00);
  }
  if (n->etype == Load) {
    pLVar3 = (LoadStoreExpr<(wabt::ExprType)44> *)
             cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
    opc.enum_ = (((LoadStoreExpr<(wabt::ExprType)21> *)pLVar3)->opcode).enum_;
    uVar1 = ((LoadStoreExpr<(wabt::ExprType)21> *)pLVar3)->offset;
    type = Opcode::GetResultType(&((LoadStoreExpr<(wabt::ExprType)21> *)pLVar3)->opcode);
  }
  else {
    if (n->etype != Store) {
      return;
    }
    pLVar3 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(n->e);
    opc.enum_ = (pLVar3->opcode).enum_;
    uVar1 = pLVar3->offset;
    type = Opcode::GetParamType2(&pLVar3->opcode);
  }
  LoadStore(this,(ulong)uVar1,opc,type,pLVar3->align,
            (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Track(const Node& n) {
    for (auto& c : n.children) Track(c);
    switch (n.etype) {
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(le.offset, le.opcode, le.opcode.GetResultType(),
                  le.align, n.children[0]);
        break;
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(se.offset, se.opcode, se.opcode.GetParamType2(),
                  se.align, n.children[0]);
        break;
      }
      default:
        break;
    }
  }